

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sexp_conflict
sexp_get_opcode_name(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op)

{
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x1b)) {
    if (*(long *)(in_RCX + 2) == 0) {
      local_8 = (sexp_conflict)0x3e;
    }
    else {
      local_8 = *(sexp_conflict *)(in_RCX + 2);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,0x1b,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_get_opcode_name (sexp ctx, sexp self, sexp_sint_t n, sexp op) {
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  else if (! sexp_opcode_name(op))
    return SEXP_FALSE;
  else
    return sexp_opcode_name(op);
}